

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall DepfileParserTestBuggyMP::Run(DepfileParserTestBuggyMP *this)

{
  Test *pTVar1;
  bool bVar2;
  undefined1 local_30 [8];
  string err;
  DepfileParserTestBuggyMP *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  bVar2 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,"foo: x y z\nx: alsoin\ny:\nz:\n",
                     (string *)local_30);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
             ,0x17a,"Parse(\"foo: x y z\\n\" \"x: alsoin\\n\" \"y:\\n\" \"z:\\n\", &err)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("inputs may not also have inputs",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                     ,0x17b,"\"inputs may not also have inputs\" == err");
  if (!bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DepfileParserTest, BuggyMP) {
  std::string err;
  EXPECT_FALSE(Parse("foo: x y z\n"
                     "x: alsoin\n"
                     "y:\n"
                     "z:\n", &err));
  ASSERT_EQ("inputs may not also have inputs", err);
}